

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQInteger __thiscall SQSharedState::ResurrectUnreachable(SQSharedState *this,SQVM *vm)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *pSVar2;
  SQObjectType SVar3;
  SQObjectValue this_00;
  SQObjectValue this_01;
  SQObjectValue SVar4;
  SQInteger SVar5;
  SQObjectValue SVar6;
  SQObject sqo;
  SQCollectable_conflict *tchain;
  SQObject local_50;
  SQVM *local_40;
  SQObjectValue local_38;
  
  local_38.pTable = (SQTable *)0x0;
  RunMark(this,vm,(SQCollectable_conflict **)&local_38.pTable);
  this_01 = (SQObjectValue)this->_gc_chain;
  this->_gc_chain = (SQCollectable_conflict *)local_38;
  if (this_01.pTable == (SQTable *)0x0) {
    this_00.pTable = (SQTable *)0x0;
    SVar5 = 0;
    this_01 = local_38;
  }
  else {
    local_40 = vm;
    this_00.pArray = SQArray::Create(this,0);
    SVar5 = 0;
    SVar4.pTable = (SQTable *)0x0;
    for (SVar6 = this_01; SVar6.pTable != (SQTable *)0x0;
        SVar6 = (SQObjectValue)((SVar6.pTable)->super_SQDelegable).super_SQCollectable._next) {
      SVar3 = (*((SVar6.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[3])(SVar6.pTable);
      if ((SVar3 != OT_FUNCPROTO) && (SVar3 != OT_OUTER)) {
        local_50._type = SVar3;
        local_50._unVal = SVar6;
        SQArray::Append(this_00.pArray,&local_50);
      }
      SVar5 = SVar5 + 1;
      SVar4 = SVar6;
    }
    if (((SVar4.pTable)->super_SQDelegable).super_SQCollectable._next != (SQCollectable *)0x0) {
      __assert_fail("rlast->_next == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                    ,0x128,"SQInteger SQSharedState::ResurrectUnreachable(SQVM *)");
    }
    pSVar2 = (SQSharedState *)this->_gc_chain;
    (SVar4.pString)->_sharedstate = pSVar2;
    if (pSVar2 != (SQSharedState *)0x0) {
      pSVar2->_types = (SQObjectPtrVec *)SVar4;
    }
    this->_gc_chain = (SQCollectable_conflict *)this_01;
    vm = local_40;
  }
  for (; this_01.pTable != (SQTable *)0x0;
      this_01 = (SQObjectValue)((this_01.pTable)->super_SQDelegable).super_SQCollectable._next) {
    SQCollectable::UnMark((SQCollectable *)this_01.pTable);
  }
  if (this_00.pTable == (SQTable *)0x0) {
    SQVM::PushNull(vm);
  }
  else {
    local_50._type = OT_ARRAY;
    pSVar1 = &((this_00.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_50._unVal = this_00;
    SQVM::Push(vm,(SQObjectPtr *)&local_50);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_50);
  }
  return SVar5;
}

Assistant:

SQInteger SQSharedState::ResurrectUnreachable(SQVM *vm)
{
    SQInteger n=0;
    SQCollectable *tchain=NULL;

    RunMark(vm,&tchain);

    SQCollectable *resurrected = _gc_chain;
    SQCollectable *t = resurrected;

    _gc_chain = tchain;

    SQArray *ret = NULL;
    if(resurrected) {
        ret = SQArray::Create(this,0);
        SQCollectable *rlast = NULL;
        while(t) {
            rlast = t;
            SQObjectType type = t->GetType();
            if(type != OT_FUNCPROTO && type != OT_OUTER) {
                SQObject sqo;
                sqo._type = type;
                sqo._unVal.pRefCounted = t;
                ret->Append(sqo);
            }
            t = t->_next;
            n++;
        }

        assert(rlast->_next == NULL);
        rlast->_next = _gc_chain;
        if(_gc_chain)
        {
            _gc_chain->_prev = rlast;
        }
        _gc_chain = resurrected;
    }

    t = _gc_chain;
    while(t) {
        t->UnMark();
        t = t->_next;
    }

    if(ret) {
        SQObjectPtr temp = ret;
        vm->Push(temp);
    }
    else {
        vm->PushNull();
    }
    return n;
}